

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# include.hpp
# Opt level: O2

int base_to_int(uchar c)

{
  int iVar1;
  undefined3 in_register_00000039;
  
  iVar1 = CONCAT31(in_register_00000039,c);
  if (iVar1 == 0x43) {
    return 1;
  }
  if (iVar1 == 0x47) {
    return 2;
  }
  if (iVar1 != 0x4e) {
    if ((iVar1 == 0x54) || (iVar1 == 0x74)) {
      return 3;
    }
    if (iVar1 == 0x67) {
      return 2;
    }
    if (iVar1 != 0x6e) {
      if (iVar1 == 99) {
        return 1;
      }
      return 0;
    }
  }
  iVar1 = rand();
  return iVar1 % 4;
}

Assistant:

int base_to_int(unsigned char c){

	switch(c){

		case 'A': case 'a': return 0; break;
		case 'C': case 'c': return 1; break;
		case 'G': case 'g': return 2; break;
		case 'T': case 't': return 3; break;
		case 'N': case 'n': return rand()%4; break;

	}

	return 0;

}